

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_diamond_box.cxx
# Opt level: O0

void fl_diamond_down_box(int x,int y,int w,int h,Fl_Color bgcolor)

{
  uint uVar1;
  uint uVar2;
  int x1_00;
  int y_00;
  uchar *puVar3;
  uchar *g;
  int y1;
  int x1;
  Fl_Color bgcolor_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  uVar1 = w & 0xfffffffe;
  uVar2 = h & 0xfffffffe;
  x1_00 = x + (int)uVar1 / 2;
  y_00 = y + (int)uVar2 / 2;
  puVar3 = fl_gray_ramp();
  fl_color((uint)puVar3[0x50]);
  fl_line(x,y_00,x1_00,y,x + uVar1,y_00);
  fl_color((uint)puVar3[0x4e]);
  fl_line(x + 1,y_00,x1_00,y + 1,x + uVar1 + -1,y_00);
  fl_color((uint)puVar3[0x48]);
  fl_line(x + 2,y_00,x1_00,y + 2,x + uVar1 + -2,y_00);
  fl_color((uint)puVar3[0x57]);
  fl_line(x + 2,y_00,x1_00,y + uVar2 + -2,x + uVar1 + -2,y_00);
  fl_color((uint)puVar3[0x55]);
  fl_line(x + 1,y_00,x1_00,y + uVar2 + -1,x + uVar1 + -1,y_00);
  fl_color((uint)puVar3[0x53]);
  fl_line(x,y_00,x1_00,y + uVar2,x + uVar1,y_00);
  Fl::set_box_color(bgcolor);
  fl_polygon(x + 3,y_00,x1_00,y + 3,x + uVar1 + -3,y_00,x1_00,y + uVar2 + -3);
  fl_color((uint)puVar3[0x41]);
  fl_loop(x + 3,y_00,x1_00,y + 3,x + uVar1 + -3,y_00,x1_00,y + uVar2 + -3);
  return;
}

Assistant:

static void fl_diamond_down_box(int x,int y,int w,int h,Fl_Color bgcolor) {
  w &= -2;
  h &= -2;
  int x1 = x+w/2;
  int y1 = y+h/2;
  const uchar *g = fl_gray_ramp();
  fl_color(g[(int)'P']); fl_line(x+0, y1, x1, y+0, x+w-0, y1);
  fl_color(g[(int)'N']); fl_line(x+1, y1, x1, y+1, x+w-1, y1);
  fl_color(g[(int)'H']); fl_line(x+2, y1, x1, y+2, x+w-2, y1);
  fl_color(g[(int)'W']); fl_line(x+2, y1, x1, y+h-2, x+w-2, y1);
  fl_color(g[(int)'U']); fl_line(x+1, y1, x1, y+h-1, x+w-1, y1);
  fl_color(g[(int)'S']); fl_line(x+0, y1, x1, y+h-0, x+w-0, y1);
  Fl::set_box_color(bgcolor);
  fl_polygon(x+3, y1, x1,y+3, x+w-3,y1, x1,y+h-3);
  fl_color(g[(int)'A']); fl_loop(x+3, y1, x1, y+3, x+w-3, y1, x1, y+h-3);
}